

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O2

void ntru_decrypt(uint16_t *plaintext,uint16_t *ciphertext,NTRUKeyPair *keypair)

{
  uint q;
  uint uVar1;
  uint uVar2;
  uint16_t *out;
  uint16_t uVar3;
  size_t i_1;
  size_t i;
  ulong uVar4;
  size_t i_2;
  ulong uVar5;
  ulong factor1;
  
  uVar2 = keypair->p;
  factor1 = (ulong)uVar2;
  q = keypair->q;
  uVar1 = keypair->w;
  uVar5 = (ulong)uVar1;
  out = (uint16_t *)safemalloc(factor1,2,0);
  ntru_ring_multiply(out,ciphertext,keypair->f3,uVar2,q);
  ntru_mod3(out,out,uVar2,q);
  ntru_normalise(out,out,uVar2,3);
  ntru_ring_multiply(plaintext,out,keypair->ginv,uVar2,3);
  ring_free(out,uVar2);
  for (uVar4 = 0; factor1 != uVar4; uVar4 = uVar4 + 1) {
    uVar2 = uVar2 - (plaintext[uVar4] + 0xffff >> 0x10 ^ 1);
  }
  uVar2 = (uVar2 ^ uVar1) & 0xffff;
  for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    plaintext[uVar4] = (plaintext[uVar4] ^ 1) & -(short)(uVar2 + 0xffff >> 0x10) ^ plaintext[uVar4];
  }
  for (; uVar5 < factor1; uVar5 = uVar5 + 1) {
    if (uVar2 == 0) {
      uVar3 = plaintext[uVar5];
    }
    else {
      uVar3 = 0;
    }
    plaintext[uVar5] = uVar3;
  }
  return;
}

Assistant:

void ntru_decrypt(uint16_t *plaintext, const uint16_t *ciphertext,
                  NTRUKeyPair *keypair)
{
    unsigned p = keypair->p, q = keypair->q, w = keypair->w;
    uint16_t *tmp = snewn(p, uint16_t);

    ntru_ring_multiply(tmp, ciphertext, keypair->f3, p, q);

    ntru_mod3(tmp, tmp, p, q);
    ntru_normalise(tmp, tmp, p, 3);

    ntru_ring_multiply(plaintext, tmp, keypair->ginv, p, 3);
    ring_free(tmp, p);

    /*
     * With luck, this should have recovered exactly the original
     * plaintext. But, as per the spec, we check whether it has
     * exactly w nonzero coefficients, and if not, then something has
     * gone wrong - and in that situation we time-safely substitute a
     * different output.
     *
     * (I don't know exactly why we do this, but I assume it's because
     * otherwise the mis-decoded output could be made to disgorge a
     * secret about the private key in some way.)
     */

    unsigned weight = p;
    for (size_t i = 0; i < p; i++)
        weight -= iszero(plaintext[i]);
    unsigned ok = iszero(weight ^ w);

    /*
     * The default failure return value consists of w 1s followed by
     * 0s.
     */
    unsigned mask = ok - 1;
    for (size_t i = 0; i < w; i++) {
        uint16_t diff = (1 ^ plaintext[i]) & mask;
        plaintext[i] ^= diff;
    }
    for (size_t i = w; i < p; i++) {
        uint16_t diff = (0 ^ plaintext[i]) & mask;
        plaintext[i] ^= diff;
    }
}